

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayCompute(sqlite3_context *ctx,int isFinal)

{
  JsonString *p;
  code *xDel;
  JsonString *pStr;
  int isFinal_local;
  sqlite3_context *ctx_local;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0);
  if (p == (JsonString *)0x0) {
    sqlite3_result_text(ctx,"[]",2,(_func_void_void_ptr *)0x0);
  }
  else {
    p->pCtx = ctx;
    jsonAppendChar(p,']');
    if (p->bErr == '\0') {
      if (isFinal == 0) {
        sqlite3_result_text(ctx,p->zBuf,(int)p->nUsed,(_func_void_void_ptr *)0xffffffffffffffff);
        p->nUsed = p->nUsed - 1;
      }
      else {
        xDel = sqlite3_free;
        if (p->bStatic != '\0') {
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
        }
        sqlite3_result_text(ctx,p->zBuf,(int)p->nUsed,xDel);
        p->bStatic = '\x01';
      }
    }
    else if (p->bErr == '\x01') {
      sqlite3_result_error_nomem(ctx);
    }
  }
  sqlite3_result_subtype(ctx,0x4a);
  return;
}

Assistant:

static void jsonArrayCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    pStr->pCtx = ctx;
    jsonAppendChar(pStr, ']');
    if( pStr->bErr ){
      if( pStr->bErr==1 ) sqlite3_result_error_nomem(ctx);
      assert( pStr->bStatic );
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT : sqlite3_free);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      pStr->nUsed--;
    }
  }else{
    sqlite3_result_text(ctx, "[]", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}